

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O0

char * __thiscall MeCab::anon_unknown_0::LatticeImpl::enumNBestAsString(LatticeImpl *this,size_t N)

{
  char *pcVar1;
  LatticeImpl *unaff_retaddr;
  StringBuffer *in_stack_00000058;
  size_t in_stack_00000060;
  LatticeImpl *in_stack_00000068;
  
  stream(unaff_retaddr);
  pcVar1 = enumNBestAsStringInternal(in_stack_00000068,in_stack_00000060,in_stack_00000058);
  return pcVar1;
}

Assistant:

const char *LatticeImpl::enumNBestAsString(size_t N) {
  return enumNBestAsStringInternal(N, stream());
}